

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# OperationsExecuter.cpp
# Opt level: O1

void __thiscall Refal2::COperationsExecuter::~COperationsExecuter(COperationsExecuter *this)

{
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *p_Var1;
  
  operator_delete(this->stack);
  CNodeList<Refal2::CUnit>::~CNodeList(&(this->fieldOfView).super_CNodeList<Refal2::CUnit>);
  p_Var1 = (this->super_CExecutionContext).Receptacle.
           super___shared_ptr<Refal2::CReceptacle,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi;
  if (p_Var1 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(p_Var1);
  }
  p_Var1 = (this->super_CExecutionContext).Program.
           super___shared_ptr<Refal2::CProgram,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi;
  if (p_Var1 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(p_Var1);
  }
  CNodeList<Refal2::CUnit>::~CNodeList((CNodeList<Refal2::CUnit> *)this);
  return;
}

Assistant:

COperationsExecuter::~COperationsExecuter()
{
	::operator delete( stack );
}